

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O0

size_t dicroce::blob_tree::_read_treeb(uint8_t *p,uint8_t *end,blob_tree *rt)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  runtime_error *prVar7;
  uint32_t *p_00;
  mapped_type *this;
  reference rt_00;
  ulong local_100;
  pair<unsigned_long,_const_unsigned_char_*> local_f8;
  uint local_e8;
  uint32_t local_e4;
  uint32_t payloadSize;
  uint32_t word_1;
  size_t i_1;
  blob_tree childObj;
  string local_78 [8];
  string name;
  uint16_t nameLen;
  ulong uStack_50;
  uint16_t shortVal;
  size_t i;
  uint32_t numChildren;
  uint32_t word;
  uint8_t type;
  uint8_t *fp;
  blob_tree *rt_local;
  uint8_t *end_local;
  uint8_t *p_local;
  
  end_local = p;
  sVar6 = _bytes_left(p,end);
  puVar2 = end_local;
  if (sVar6 < 5) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Buffer too small to deserialize blob_tree.");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = *end_local;
  p_00 = (uint32_t *)(end_local + 1);
  if ((uVar1 == '\0') || (uVar1 == '\x01')) {
    end_local = end_local + 5;
    uVar5 = ntohl(*p_00);
    if (uVar1 == '\0') {
      for (uStack_50 = 0; uStack_50 < uVar5; uStack_50 = uStack_50 + 1) {
        sVar6 = _bytes_left(end_local,end);
        if (sVar6 < 2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Buffer too small to deserialize blob_tree.");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar4 = *(uint16_t *)end_local;
        end_local = end_local + 2;
        uVar4 = ntohs(uVar4);
        sVar6 = _bytes_left(end_local,end);
        puVar3 = end_local;
        if (sVar6 < uVar4) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Buffer too small to deserialize blob_tree.");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_78,(char *)puVar3,(ulong)uVar4,
                   (allocator *)((long)&childObj._payload.second + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&childObj._payload.second + 7));
        end_local = end_local + uVar4;
        blob_tree((blob_tree *)&i_1);
        sVar6 = _read_treeb(end_local,end,(blob_tree *)&i_1);
        end_local = end_local + sVar6;
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
               ::operator[](&rt->_children,(key_type *)local_78);
        operator=(this,(blob_tree *)&i_1);
        ~blob_tree((blob_tree *)&i_1);
        std::__cxx11::string::~string(local_78);
      }
    }
    else {
      std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::resize
                (&rt->_childrenByIndex,(ulong)uVar5);
      for (_payloadSize = 0; puVar3 = end_local, _payloadSize < uVar5;
          _payloadSize = _payloadSize + 1) {
        rt_00 = std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::operator[]
                          (&rt->_childrenByIndex,_payloadSize);
        sVar6 = _read_treeb(puVar3,end,rt_00);
        end_local = end_local + sVar6;
      }
    }
  }
  else {
    end_local = (uint8_t *)p_00;
    sVar6 = _bytes_left((uint8_t *)p_00,end);
    if (sVar6 < 4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Buffer too small to deserialize blob_tree.");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_e4 = *(uint32_t *)end_local;
    end_local = end_local + 4;
    local_e8 = ntohl(local_e4);
    sVar6 = _bytes_left(end_local,end);
    if (sVar6 < local_e8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Buffer too small to deserialize blob_tree.");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_100 = (ulong)local_e8;
    local_f8 = std::make_pair<unsigned_long,unsigned_char_const*&>(&local_100,&end_local);
    std::pair<unsigned_long,_const_unsigned_char_*>::operator=(&rt->_payload,&local_f8);
    end_local = end_local + local_e8;
  }
  return (long)end_local - (long)puVar2;
}

Assistant:

static size_t _read_treeb(const uint8_t* p, const uint8_t* end, blob_tree& rt)
    {
        if(_bytes_left(p, end) < 5)
            throw std::runtime_error("Buffer too small to deserialize blob_tree.");

        const uint8_t* fp = p;
        uint8_t type = *p;
        ++p;

        if(type == NT_OBJECT || type == NT_ARRAY)
        {
            uint32_t word = *(uint32_t*)p;
            p+=sizeof(uint32_t);
            uint32_t numChildren = ntohl(word);

            if(type == NT_OBJECT)
            {
                for(size_t i = 0; i < numChildren; ++i)
                {
                    if(_bytes_left(p, end) < sizeof(uint16_t))
                        throw std::runtime_error("Buffer too small to deserialize blob_tree.");

                    uint16_t shortVal = *(uint16_t*)p;
                    p+=sizeof(uint16_t);
                    uint16_t nameLen = ntohs(shortVal);

                    if(_bytes_left(p, end) < nameLen)
                        throw std::runtime_error("Buffer too small to deserialize blob_tree.");

                    std::string name((char*)p, nameLen);
                    p+=nameLen;
                    blob_tree childObj;
                    p+=_read_treeb(p, end, childObj);
                    rt._children[name] = childObj;
                }
            }
            else
            {
                rt._childrenByIndex.resize(numChildren);
                for(size_t i = 0; i < numChildren; ++i)
                    p+=_read_treeb(p, end, rt._childrenByIndex[i]);
            }
        }
        else
        {
            if(_bytes_left(p, end) < sizeof(uint32_t))
                throw std::runtime_error("Buffer too small to deserialize blob_tree.");

            uint32_t word = *(uint32_t*)p;
            p+=sizeof(uint32_t);
            uint32_t payloadSize = ntohl(word);

            if(_bytes_left(p, end) < payloadSize)
                throw std::runtime_error("Buffer too small to deserialize blob_tree.");

            rt._payload = std::make_pair((size_t)payloadSize, p);
            p+=payloadSize;
        }

        return p - fp;
    }